

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonGeneration.hpp
# Opt level: O0

string * helics::generateJsonErrorResponse(JsonErrorCodes code,string *message)

{
  undefined4 in_ESI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined1 in_stack_00000160 [16];
  undefined1 in_stack_00000170 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x;
  value<fmt::v11::context> *this;
  undefined8 in_stack_ffffffffffffff28;
  undefined4 local_b4;
  char *local_b0;
  undefined8 local_a8;
  undefined4 local_88 [8];
  undefined8 local_68;
  undefined4 *local_60;
  char *local_58;
  undefined8 uStack_50;
  value<fmt::v11::context> *local_48;
  undefined4 *local_40;
  char *local_38;
  undefined8 uStack_30;
  undefined4 *local_18;
  undefined4 *local_10;
  undefined8 *local_8;
  
  local_b0 = "{{\n  \"error\":{{\n    \"code\":{},\n    \"message\":{}\n  }}\n}}";
  local_a8 = 0x37;
  this = (value<fmt::v11::context> *)&stack0xffffffffffffff28;
  x = in_RDI;
  local_b4 = in_ESI;
  generateJsonQuotedString((string *)in_stack_ffffffffffffff28);
  local_38 = local_b0;
  uStack_30 = local_a8;
  local_40 = &local_b4;
  local_58 = local_b0;
  uStack_50 = local_a8;
  local_18 = local_88;
  local_88[0] = local_b4;
  local_48 = this;
  ::fmt::v11::detail::value<fmt::v11::context>::
  value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
            (this,x);
  local_8 = &local_68;
  local_10 = local_88;
  local_68 = 0xd1;
  local_60 = local_10;
  ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_00000170,(format_args)in_stack_00000160);
  std::__cxx11::string::~string(in_RDI);
  return (string *)in_RDI;
}

Assistant:

inline std::string generateJsonErrorResponse(JsonErrorCodes code, const std::string& message)
{
    return fmt::format("{{\n  \"error\":{{\n    \"code\":{},\n    \"message\":{}\n  }}\n}}",
                       static_cast<std::int32_t>(code),
                       generateJsonQuotedString(message));
}